

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

bool __thiscall btSingleSweepCallback::process(btSingleSweepCallback *this,btBroadphaseProxy *proxy)

{
  float fVar1;
  ConvexResultCallback *pCVar2;
  btCollisionObject *pbVar3;
  int iVar4;
  btCollisionObjectWrapper local_38;
  
  pCVar2 = this->m_resultCallback;
  fVar1 = pCVar2->m_closestHitFraction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pbVar3 = (btCollisionObject *)proxy->m_clientObject;
    iVar4 = (*pCVar2->_vptr_ConvexResultCallback[2])(pCVar2,pbVar3->m_broadphaseHandle);
    if ((char)iVar4 != '\0') {
      local_38.m_shape = pbVar3->m_collisionShape;
      local_38.m_parent = (btCollisionObjectWrapper *)0x0;
      local_38.m_worldTransform = &pbVar3->m_worldTransform;
      local_38.m_partId = -1;
      local_38.m_index = -1;
      local_38.m_collisionObject = pbVar3;
      btCollisionWorld::objectQuerySingleInternal
                (this->m_castShape,&this->m_convexFromTrans,&this->m_convexToTrans,&local_38,
                 this->m_resultCallback,this->m_allowedCcdPenetration);
    }
  }
  return (bool)(-(fVar1 != 0.0) & 1);
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		///terminate further convex sweep tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == btScalar(0.f))
			return false;

		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) {
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			m_world->objectQuerySingle(m_castShape, m_convexFromTrans,m_convexToTrans,
				collisionObject,
				collisionObject->getCollisionShape(),
				collisionObject->getWorldTransform(),
				m_resultCallback,
				m_allowedCcdPenetration);
		}

		return true;
	}